

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiNodeAnim **_dest,aiNodeAnim *src)

{
  aiNodeAnim *__dest;
  
  if (src == (aiNodeAnim *)0x0 || _dest == (aiNodeAnim **)0x0) {
    return;
  }
  __dest = (aiNodeAnim *)operator_new(0x438);
  *_dest = __dest;
  memcpy(__dest,src,0x438);
  GetArrayCopy<aiVectorKey>(&__dest->mPositionKeys,__dest->mNumPositionKeys);
  GetArrayCopy<aiVectorKey>(&__dest->mScalingKeys,__dest->mNumScalingKeys);
  GetArrayCopy<aiQuatKey>(&__dest->mRotationKeys,__dest->mNumRotationKeys);
  return;
}

Assistant:

void SceneCombiner::Copy(aiNodeAnim** _dest, const aiNodeAnim* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiNodeAnim* dest = *_dest = new aiNodeAnim();

    // get a flat copy
    ::memcpy(dest,src,sizeof(aiNodeAnim));

    // and reallocate all arrays
    GetArrayCopy( dest->mPositionKeys, dest->mNumPositionKeys );
    GetArrayCopy( dest->mScalingKeys,  dest->mNumScalingKeys );
    GetArrayCopy( dest->mRotationKeys, dest->mNumRotationKeys );
}